

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::PickerPrivate::normalizeOffset(PickerPrivate *this)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  QModelIndex local_40;
  
  pPVar1 = (this->q->d).d;
  pQVar2 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pPVar1->root);
  iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_40);
  iVar6 = this->itemsCount;
  if (iVar3 < iVar6) {
    pPVar1 = (this->q->d).d;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pPVar1->root);
    iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_40);
    iVar6 = iVar6 - iVar3;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6 + -1;
    }
    if (this->drawItemOffset < 0) {
      this->drawItemOffset = 0;
    }
    else {
      iVar6 = iVar3 * this->itemTopMargin + iVar6 * this->stringHeight;
      if (iVar6 < this->drawItemOffset) {
        this->drawItemOffset = iVar6;
      }
    }
  }
  else {
    iVar3 = this->stringHeight + this->itemTopMargin;
    uVar5 = (long)this->drawItemOffset / (long)iVar3;
    iVar6 = (int)uVar5;
    uVar5 = uVar5 & 0xffffffff;
    this->drawItemOffset = this->drawItemOffset % iVar3;
    if (iVar6 < 0) {
      do {
        makeNextIndex(this,&this->topItemIndex);
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    else if (iVar6 != 0) {
      do {
        makePrevIndex(this,&this->topItemIndex);
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    if (0 < this->drawItemOffset) {
      this->drawItemOffset = this->drawItemOffset - (this->itemTopMargin + this->stringHeight);
      makePrevIndex(this,&this->topItemIndex);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::normalizeOffset()
{
	if( q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		if( drawItemOffset < 0 )
			drawItemOffset = 0;
		else if( drawItemOffset > maxOffset )
			drawItemOffset = maxOffset;
	}
	else
	{
		int fullItemsCount = drawItemOffset /
			( itemTopMargin + stringHeight );

		drawItemOffset -= ( itemTopMargin + stringHeight ) * fullItemsCount;

		if( fullItemsCount < 0 )
		{
			for( int i = fullItemsCount; i < 0; ++i )
				makeNextIndex( topItemIndex );
		}
		else if( fullItemsCount > 0 )
		{
			for( int i = 0; i < fullItemsCount; ++i )
				makePrevIndex( topItemIndex );
		}

		if( drawItemOffset > 0 )
		{
			drawItemOffset -= ( itemTopMargin + stringHeight );
			makePrevIndex( topItemIndex );
		}
	}
}